

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zreadhb.c
# Opt level: O2

void zreadhb(FILE *fp,int *nrow,int *ncol,int_t *nonz,doublecomplex **nzval,int_t **rowind,
            int_t **colptr)

{
  int *piVar1;
  doublecomplex *z;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int_t *addr;
  int_t *addr_00;
  doublecomplex *addr_01;
  double dVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  int_t *addr_02;
  int_t *addr_03;
  void *addr_04;
  ulong uVar8;
  ulong uVar9;
  int_t *piVar10;
  doublecomplex *pdVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  FILE *pFVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  int_t *addr_05;
  int iVar20;
  double *pdVar21;
  int iVar22;
  uint uVar23;
  bool bVar24;
  int tmp;
  doublecomplex **local_228;
  int_t **local_220;
  FILE *local_218;
  int_t *local_210;
  int_t *local_208;
  int valsize;
  int valnum;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char buf [100];
  char msg [256];
  
  local_228 = nzval;
  local_220 = rowind;
  local_218 = (FILE *)fp;
  fgets(buf,100,(FILE *)fp);
  fputs(buf,_stdout);
  iVar15 = 0;
  iVar7 = 5;
  iVar22 = 0;
  while (pFVar16 = local_218, iVar20 = iVar7 + -1, iVar7 != 0) {
    __isoc99_fscanf(local_218,"%14c",buf);
    buf[0xe] = '\0';
    __isoc99_sscanf(buf,"%d",&tmp);
    if (iVar7 == 2) {
      iVar15 = tmp;
    }
    iVar6 = tmp;
    if (tmp == 0) {
      iVar6 = iVar22;
    }
    bVar24 = iVar7 == 1;
    iVar7 = iVar20;
    if (bVar24) {
      iVar22 = iVar6;
    }
  }
  zDumpLine((FILE *)local_218);
  __isoc99_fscanf(pFVar16,"%3c",type);
  __isoc99_fscanf(pFVar16,"%11c",buf);
  type[3] = '\0';
  __isoc99_fscanf(pFVar16,"%14c",buf);
  iVar7 = atoi(buf);
  *nrow = iVar7;
  __isoc99_fscanf(pFVar16,"%14c",buf);
  iVar7 = atoi(buf);
  *ncol = iVar7;
  __isoc99_fscanf(pFVar16,"%14c",buf);
  iVar7 = atoi(buf);
  *nonz = iVar7;
  __isoc99_fscanf(pFVar16,"%14c",buf);
  tmp = atoi(buf);
  if (tmp != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*nrow != *ncol) {
    puts("Matrix is not square.");
  }
  pFVar16 = local_218;
  zDumpLine((FILE *)local_218);
  zallocateA(*ncol,*nonz,local_228,local_220,colptr);
  __isoc99_fscanf(pFVar16,"%16c",buf);
  zParseIntFormat(buf,&colnum,&colsize);
  __isoc99_fscanf(pFVar16,"%16c",buf);
  zParseIntFormat(buf,&rownum,&rowsize);
  __isoc99_fscanf(pFVar16,"%20c",buf);
  zParseFloatFormat(buf,&valnum,&valsize);
  __isoc99_fscanf(pFVar16,"%20c",buf);
  zDumpLine((FILE *)pFVar16);
  if (iVar22 != 0) {
    zDumpLine((FILE *)pFVar16);
  }
  ReadVector((FILE *)pFVar16,*ncol + 1,*colptr,colnum,colsize);
  ReadVector((FILE *)pFVar16,*nonz,*local_220,rownum,rowsize);
  if (iVar15 != 0) {
    zReadValues((FILE *)pFVar16,*nonz,*local_228,valnum,valsize);
  }
  if ((type[1] & 0xdfU) == 0x53) {
    uVar23 = *ncol;
    addr = *local_220;
    addr_00 = *colptr;
    addr_01 = *local_228;
    iVar15 = uVar23 + 1;
    addr_02 = intMalloc(iVar15);
    if (addr_02 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xd5,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
      superlu_abort_and_exit(msg);
    }
    addr_03 = intMalloc(iVar15);
    if (addr_03 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xd7,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
      superlu_abort_and_exit(msg);
    }
    local_208 = intMalloc(*nonz);
    if (local_208 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",0xd9,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
      superlu_abort_and_exit(msg);
    }
    addr_04 = superlu_malloc((long)*nonz << 4);
    if (addr_04 == (void *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xdb,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
      superlu_abort_and_exit(msg);
    }
    uVar8 = 0;
    uVar19 = 0;
    if (0 < (int)uVar23) {
      uVar19 = (ulong)uVar23;
    }
    for (; uVar19 != uVar8; uVar8 = uVar8 + 1) {
      addr_02[uVar8] = 0;
    }
    uVar8 = 0;
    while (uVar8 != uVar19) {
      piVar1 = addr_00 + uVar8;
      uVar8 = uVar8 + 1;
      for (lVar13 = (long)*piVar1; lVar13 < addr_00[uVar8]; lVar13 = lVar13 + 1) {
        addr_02[addr[lVar13]] = addr_02[addr[lVar13]] + 1;
      }
    }
    *addr_03 = 0;
    for (uVar8 = 0; uVar19 != uVar8; uVar8 = uVar8 + 1) {
      addr_03[uVar8 + 1] = addr_02[uVar8] + addr_03[uVar8];
      addr_02[uVar8] = addr_03[uVar8];
    }
    uVar8 = 0;
    while (uVar9 = uVar8, uVar9 != uVar19) {
      lVar13 = (long)addr_00[uVar9];
      pdVar11 = addr_01 + lVar13;
      for (; uVar8 = uVar9 + 1, lVar13 < addr_00[uVar9 + 1]; lVar13 = lVar13 + 1) {
        iVar7 = addr[lVar13];
        local_208[addr_02[iVar7]] = (int_t)uVar9;
        dVar4 = pdVar11->i;
        pdVar21 = (double *)((long)addr_04 + (long)addr_02[iVar7] * 0x10);
        *pdVar21 = pdVar11->r;
        pdVar21[1] = dVar4;
        addr_02[iVar7] = addr_02[iVar7] + 1;
        pdVar11 = pdVar11 + 1;
      }
    }
    lVar13 = (long)*nonz * 2 - (long)(int)uVar23;
    local_210 = intMalloc(iVar15);
    if (local_210 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xf4,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
      superlu_abort_and_exit(msg);
    }
    piVar10 = intMalloc((int_t)lVar13);
    if (piVar10 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",0xf6,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
      superlu_abort_and_exit(msg);
    }
    pdVar11 = (doublecomplex *)superlu_malloc(lVar13 * 0x10);
    if (pdVar11 == (doublecomplex *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xf8,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadhb.c");
      superlu_abort_and_exit(msg);
    }
    *local_210 = 0;
    uVar23 = 0;
    addr_05 = local_208;
    uVar8 = 0;
    while (uVar8 != uVar19) {
      lVar17 = (long)addr_03[uVar8];
      uVar9 = uVar8 + 1;
      pdVar21 = (double *)(lVar17 * 0x10 + (long)addr_04);
      for (; lVar12 = (long)(int)uVar23, lVar17 < addr_03[uVar9]; lVar17 = lVar17 + 1) {
        if (uVar8 != (uint)addr_05[lVar17]) {
          piVar10[lVar12] = addr_05[lVar17];
          z = pdVar11 + lVar12;
          dVar4 = pdVar21[1];
          pdVar11[lVar12].r = *pdVar21;
          pdVar11[lVar12].i = dVar4;
          dVar4 = z_abs1(z);
          if (dVar4 < 4.047e-300) {
            printf("%5d: %e\t%e\n",SUB84(z->r,0),z->i,(ulong)uVar23);
          }
          uVar23 = uVar23 + 1;
          addr_05 = local_208;
        }
        pdVar21 = pdVar21 + 2;
      }
      lVar14 = (long)addr_00[uVar8];
      lVar18 = 0;
      for (lVar17 = lVar14; lVar17 < addr_00[uVar9]; lVar17 = lVar17 + 1) {
        *(undefined4 *)((long)piVar10 + lVar18 + lVar12 * 4) =
             *(undefined4 *)((long)addr + lVar18 + lVar14 * 4);
        puVar2 = (undefined8 *)((long)&addr_01[lVar14].r + lVar18 * 4);
        uVar5 = puVar2[1];
        puVar3 = (undefined8 *)((long)&pdVar11[lVar12].r + lVar18 * 4);
        *puVar3 = *puVar2;
        puVar3[1] = uVar5;
        lVar18 = lVar18 + 4;
        uVar23 = uVar23 + 1;
      }
      local_210[uVar9] = uVar23;
      uVar8 = uVar9;
    }
    printf("FormFullA: new_nnz = %lld\n",lVar13);
    superlu_free(addr_01);
    superlu_free(addr);
    superlu_free(addr_00);
    superlu_free(addr_02);
    superlu_free(addr_04);
    superlu_free(addr_05);
    superlu_free(addr_03);
    *local_228 = pdVar11;
    *local_220 = piVar10;
    *colptr = local_210;
    *nonz = (int_t)lVar13;
    pFVar16 = local_218;
  }
  fclose(pFVar16);
  return;
}

Assistant:

void
zreadhb(FILE *fp, int *nrow, int *ncol, int_t *nonz,
	doublecomplex **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0, rhscrd = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<5; i++) {
	fscanf(fp, "%14c", buf); buf[14] = 0;
	sscanf(buf, "%d", &tmp);
	if (i == 3) numer_lines = tmp;
	if (i == 4 && tmp) rhscrd = tmp;
    }
    zDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#if ( DEBUGlevel>=1 )
    printf("Matrix type %s\n", type);
#endif
    
    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);
    
    if (tmp != 0)
	  printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
	printf("Matrix is not square.\n");
    zDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    zallocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    zParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    zParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    zParseFloatFormat(buf, &valnum, &valsize);
    fscanf(fp, "%20c", buf);
    zDumpLine(fp);

    /* Line 5: right-hand side */    
    if ( rhscrd ) zDumpLine(fp); /* skip RHSFMT */
    
#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif
    
    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        zReadValues(fp, *nonz, *nzval, valnum, valsize);
    }
    
    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}